

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O3

ActionResults * __thiscall BlueRoomThreeAction::Pick(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  itemType local_5c;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BALL) {
    local_5c = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == B_ROOM3) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_38.field_2;
      local_38._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less."
                 ,"");
      ActionResults::ActionResults(pAVar3,CURRENT,&local_38);
      _Var4._M_p = local_38._M_dataplus._M_p;
      goto LAB_00121ed1;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 != PIPE) {
    pAVar3 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
    return pAVar3;
  }
  pAVar3 = (ActionResults *)operator_new(0x30);
  paVar5 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today."
             ,"");
  ActionResults::ActionResults(pAVar3,CURRENT,&local_58);
  _Var4._M_p = local_58._M_dataplus._M_p;
LAB_00121ed1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return pAVar3;
}

Assistant:

ActionResults * BlueRoomThreeAction::Pick() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == B_ROOM3){
        return new ActionResults(CURRENT, "You pick up the weighty steel ball. It is no fanciful feat, but you feel accomplished none the less.");
    } else if(commands->getMainItem() == PIPE){
        return new ActionResults(CURRENT, "You attempt to pry loose a section of pipe, but the metal is so cold that you can only hold on for a second. No pipe shall you hold today.");
    } else {
        return AbstractRoomAction::Pick();
    }
}